

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O3

void easm_cfold_sinsn(easm_sinsn *sinsn)

{
  easm_operand **ppeVar1;
  int iVar2;
  easm_operand *peVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = sinsn->operandsnum;
  if (0 < iVar2) {
    ppeVar1 = sinsn->operands;
    lVar4 = 0;
    do {
      peVar3 = ppeVar1[lVar4];
      if (0 < peVar3->exprsnum) {
        lVar5 = 0;
        do {
          easm_cfold_expr(peVar3->exprs[lVar5]);
          lVar5 = lVar5 + 1;
          ppeVar1 = sinsn->operands;
          peVar3 = ppeVar1[lVar4];
        } while (lVar5 < peVar3->exprsnum);
        iVar2 = sinsn->operandsnum;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

void easm_cfold_sinsn(struct easm_sinsn *sinsn) {
	int i, j;
	for (i = 0; i < sinsn->operandsnum; i++)
		for (j = 0; j < sinsn->operands[i]->exprsnum; j++)
			easm_cfold_expr(sinsn->operands[i]->exprs[j]);
}